

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O3

void eputi(int i,int r)

{
  if (i < 0) {
    eputc('-');
    i = -i;
  }
  if ((uint)r <= (uint)i) {
    eputi((uint)i / (uint)r,r);
  }
  eputc((char)((uint)i % (uint)r) + '0');
  return;
}

Assistant:

static void
eputi(int i, int r)
{
	int	 q;

	if (i < 0) {
		eputc('-');
		i = -i;
	}
	if ((q = i / r) != 0)
		eputi(q, r);
	eputc(i % r + '0');
}